

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::BuildNodeHierarchy
          (CrateReader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *pathIndexes,
          vector<int,_std::allocator<int>_> *elementTokenIndexes,
          vector<int,_std::allocator<int>_> *jumps,vector<bool,_std::allocator<bool>_> *visit_table,
          size_t _curIndex,int64_t _parentNodeIndex)

{
  pointer pcVar1;
  pointer puVar2;
  pointer pPVar3;
  pointer pNVar4;
  uint *puVar5;
  pointer piVar6;
  bool bVar7;
  _Elt_pointer puVar8;
  _Elt_pointer plVar9;
  ostream *poVar10;
  ulong uVar11;
  pointer pcVar12;
  ulong uVar13;
  int iVar14;
  pointer pcVar15;
  char *pcVar16;
  unsigned_long uVar17;
  reference rVar18;
  int64_t parentNodeIndex;
  size_t subtreeEndIdx;
  string name;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  stack<long,_std::deque<long,_std::allocator<long>_>_> parentNodeIndexStack;
  Node node;
  ostringstream ss_e_7;
  pointer local_508;
  ulong local_500;
  ulong local_4f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4f0;
  pointer local_4e8;
  vector<int,_std::allocator<int>_> *local_4e0;
  pointer local_4d8;
  pointer local_4d0 [4];
  string local_4b0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_490;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_440;
  _Deque_base<long,_std::allocator<long>_> local_3f0;
  Node local_3a0;
  ostringstream local_1a8 [376];
  
  ::std::stack<long,std::deque<long,std::allocator<long>>>::
  stack<std::deque<long,std::allocator<long>>,void>
            ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)&local_3f0);
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &local_490);
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &local_440);
  local_4f8 = (this->_config).maxPathIndicesDecodeIteration;
  uVar17 = ((long)(pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 2) - 1;
  local_508 = (pointer)_parentNodeIndex;
  uVar13 = 0;
LAB_001913a1:
  if (uVar13 < local_4f8) {
    local_4d8 = (pointer)(uVar17 + 1);
    local_500 = uVar13;
LAB_001913b7:
    uVar13 = local_500;
    if (local_4d8 <= _curIndex) goto LAB_00191796;
    local_4e8 = (pointer)_curIndex;
    if (local_508 == (pointer)0xffffffffffffffff) {
      if ((pointer)_curIndex != (pointer)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
        poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,"[Crate]");
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x12eb);
        ::std::operator<<(poVar10," ");
        pcVar16 = "TODO: Multiple root nodes.";
        goto LAB_0019248c;
      }
      puVar5 = (pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish == puVar5) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
        poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,"[Crate]");
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
        poVar10 = ::std::operator<<(poVar10,"():");
        iVar14 = 0x12ef;
        goto LAB_00192247;
      }
      uVar13 = (ulong)*puVar5;
      if (uVar13 < (ulong)(((long)(this->_paths).
                                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_paths).
                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xd0)) {
        if ((ulong)(((long)(this->_nodes).
                           super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_nodes).
                          super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x1f8) <= uVar13) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
          poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          iVar14 = 0x12f8;
          goto LAB_0019234d;
        }
        if ((ulong)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= uVar13) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
          poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          iVar14 = 0x12fd;
          goto LAB_001923df;
        }
        rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar13);
        if ((*rVar18._M_p & rVar18._M_mask) != 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
          poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          iVar14 = 0x1301;
          goto LAB_00192471;
        }
        Node::Node(&local_3a0,(int64_t)local_508,
                   (this->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13);
        Node::operator=((this->_nodes).
                        super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar13,&local_3a0);
        Node::~Node(&local_3a0);
        rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar13);
        *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
        local_508 = (pointer)0x0;
LAB_0019167f:
        piVar6 = (jumps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar12 = (pointer)((long)(jumps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
        if (pcVar12 <= local_4e8) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
          poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x134f);
          ::std::operator<<(poVar10," ");
          pcVar16 = "Index is out-of-range";
          goto LAB_0019248c;
        }
        iVar14 = piVar6[(long)local_4e8];
        if ((long)iVar14 < 1) {
          if (iVar14 == -1) goto LAB_001916e4;
        }
        else {
          pcVar1 = local_4e8 + iVar14;
          pcVar15 = pcVar1;
          if (pcVar12 <= pcVar1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
            poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
            poVar10 = ::std::operator<<(poVar10,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                       );
            poVar10 = ::std::operator<<(poVar10,":");
            poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
            poVar10 = ::std::operator<<(poVar10,"():");
            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x135a);
            ::std::operator<<(poVar10," ");
            pcVar16 = "jump index corrupted.";
            goto LAB_0019248c;
          }
          while( true ) {
            local_4d0[0] = pcVar15;
            local_4b0._M_dataplus._M_p = pcVar1;
            if (pcVar12 <= pcVar15) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
              poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x136f);
              ::std::operator<<(poVar10," ");
              pcVar16 = "jump indices seems corrupted.";
              goto LAB_0019248c;
            }
            if (piVar6[(long)pcVar15] < -1) break;
            pcVar15 = pcVar15 + 1;
          }
          if (pcVar1 <= pcVar15) {
            if (iVar14 != 1) {
              local_3a0._parent = (int64_t)(local_4e8 + 1);
              ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>
                        ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_490,
                         (unsigned_long *)&local_3a0);
              local_3a0._parent = (int64_t)(pcVar1 + -1);
              ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>
                        ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_440,
                         (unsigned_long *)&local_3a0);
              local_3a0._parent = (int64_t)local_4e8;
              ::std::deque<long,_std::allocator<long>_>::emplace_back<long>
                        ((deque<long,_std::allocator<long>_> *)&local_3f0,&local_3a0._parent);
            }
            ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_490,
                       (value_type_conflict1 *)&local_4b0);
            ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_440,
                       (value_type_conflict1 *)local_4d0);
            ::std::deque<long,_std::allocator<long>_>::push_back
                      ((deque<long,_std::allocator<long>_> *)&local_3f0,
                       (value_type_conflict5 *)&local_508);
            uVar13 = local_500 + 1;
            goto LAB_00191796;
          }
LAB_001916e4:
          local_508 = local_4e8;
        }
        _curIndex = (size_t)(local_4e8 + 1);
        goto LAB_001913b7;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
      poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
      poVar10 = ::std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 );
      poVar10 = ::std::operator<<(poVar10,"[Crate]");
      poVar10 = ::std::operator<<(poVar10,":");
      poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
      poVar10 = ::std::operator<<(poVar10,"():");
      iVar14 = 0x12f4;
    }
    else {
      puVar2 = (pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pcVar12 = (pointer)((long)(pathIndexes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
      if ((long)pcVar12 <= (long)local_508) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
        poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,"[Crate]");
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x130f);
        ::std::operator<<(poVar10," ");
        pcVar16 = "Parent Index out-of-range.";
        goto LAB_0019248c;
      }
      if (pcVar12 <= _curIndex) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
        poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,"[Crate]");
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
        poVar10 = ::std::operator<<(poVar10,"():");
        iVar14 = 0x1313;
LAB_00192247:
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar14);
        ::std::operator<<(poVar10," ");
        pcVar16 = "Index out-of-range.";
        goto LAB_0019248c;
      }
      uVar13 = (ulong)puVar2[_curIndex];
      if ((ulong)(((long)(this->_paths).
                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(this->_paths).
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0xd0) <= uVar13) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
        poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,"[Crate]");
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
        poVar10 = ::std::operator<<(poVar10,"():");
        iVar14 = 0x131b;
        goto LAB_0019234d;
      }
      if (uVar13 < (ulong)(((long)(this->_nodes).
                                  super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_nodes).
                                 super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x1f8)) {
        if ((ulong)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= uVar13) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
          poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          iVar14 = 0x1324;
LAB_001923df:
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar14);
          ::std::operator<<(poVar10," ");
          pcVar16 = "[InternalError] out-of-range.";
          goto LAB_0019248c;
        }
        rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar13);
        if ((*rVar18._M_p & rVar18._M_mask) != 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
          poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          iVar14 = 0x1328;
LAB_00192471:
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar14);
          ::std::operator<<(poVar10," ");
          pcVar16 = "Circular referencing detected. Invalid Prim tree representation.";
          goto LAB_0019248c;
        }
        if ((this->_nodes).
            super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar13]._parent != -2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
          poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x132e);
          ::std::operator<<(poVar10," ");
          pcVar16 = "???: Maybe corrupted path hierarchy?.";
          goto LAB_0019248c;
        }
        local_4f0 = pathIndexes;
        local_4e0 = jumps;
        Node::Node(&local_3a0,(int64_t)local_508,
                   (this->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13);
        Node::operator=((this->_nodes).
                        super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar13,&local_3a0);
        rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[](visit_table,uVar13);
        *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
        pPVar3 = (this->_elemPaths).
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar13 < (ulong)(((long)(this->_elemPaths).
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) /
                            0xd0)) {
          Path::full_path_name_abi_cxx11_(&local_4b0,pPVar3 + uVar13);
          puVar2 = (local_4f0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_508 <
              (pointer)((long)(local_4f0->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2)) {
            uVar11 = (ulong)puVar2[(long)local_508];
            pNVar4 = (this->_nodes).
                     super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar11 < (ulong)(((long)(this->_nodes).
                                        super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4) /
                                0x1f8)) {
              bVar7 = Node::AddChildren(pNVar4 + uVar11,&local_4b0,uVar13);
              if (bVar7) {
                ::std::__cxx11::string::_M_dispose();
                Node::~Node(&local_3a0);
                pathIndexes = local_4f0;
                jumps = local_4e0;
                goto LAB_0019167f;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              poVar10 = ::std::operator<<((ostream *)local_1a8,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,"[Crate]");
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x134a);
              ::std::operator<<(poVar10," ");
              pcVar16 = "Invalid path index.";
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              poVar10 = ::std::operator<<((ostream *)local_1a8,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,"[Crate]");
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1345);
              ::std::operator<<(poVar10," ");
              pcVar16 = "PathIndex out-of-range.";
            }
            poVar10 = ::std::operator<<((ostream *)local_1a8,pcVar16);
            ::std::operator<<(poVar10,"\n");
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)&this->_err);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            poVar10 = ::std::operator<<((ostream *)local_1a8,"[error]");
            poVar10 = ::std::operator<<(poVar10,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                       );
            poVar10 = ::std::operator<<(poVar10,"[Crate]");
            poVar10 = ::std::operator<<(poVar10,":");
            poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
            poVar10 = ::std::operator<<(poVar10,"():");
            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1340);
            ::std::operator<<(poVar10," ");
            poVar10 = ::std::operator<<((ostream *)local_1a8,"ParentNodeIdx out-of-range.");
            ::std::operator<<(poVar10,"\n");
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)&this->_err);
          }
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          poVar10 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,"[Crate]");
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1337);
          ::std::operator<<(poVar10," ");
          poVar10 = ::std::operator<<((ostream *)local_1a8,"PathIndex out-of-range.");
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)&this->_err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        }
        Node::~Node(&local_3a0);
        goto LAB_001924dd;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
      poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
      poVar10 = ::std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 );
      poVar10 = ::std::operator<<(poVar10,"[Crate]");
      poVar10 = ::std::operator<<(poVar10,":");
      poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
      poVar10 = ::std::operator<<(poVar10,"():");
      iVar14 = 0x131f;
    }
LAB_0019234d:
    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar14);
    ::std::operator<<(poVar10," ");
    pcVar16 = "PathIndex out-of-range.";
    goto LAB_0019248c;
  }
  goto LAB_00191a10;
LAB_00191796:
  if (local_490._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_490._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00191a10:
    bVar7 = true;
    if (local_4f8 <= uVar13) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
      poVar10 = ::std::operator<<((ostream *)&local_3a0,"[error]");
      poVar10 = ::std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 );
      poVar10 = ::std::operator<<(poVar10,":");
      poVar10 = ::std::operator<<(poVar10,"BuildNodeHierarchy");
      poVar10 = ::std::operator<<(poVar10,"():");
      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x13a3);
      ::std::operator<<(poVar10," ");
      pcVar16 = "PathIndex tree Too deep.";
LAB_0019248c:
      poVar10 = ::std::operator<<((ostream *)&local_3a0,pcVar16);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)&this->_err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3a0);
LAB_001924dd:
      bVar7 = false;
    }
    ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_440);
    ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_490);
    ::std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_3f0);
    return bVar7;
  }
  puVar8 = local_490._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_490._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_490._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar8 = local_490._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  _curIndex = puVar8[-1];
  local_500 = uVar13;
  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_490);
  puVar8 = local_440._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_440._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_440._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar8 = local_440._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  uVar17 = puVar8[-1];
  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_440);
  plVar9 = local_3f0._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_3f0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_3f0._M_impl.super__Deque_impl_data._M_finish._M_first) {
    plVar9 = local_3f0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_508 = (pointer)plVar9[-1];
  ::std::deque<long,_std::allocator<long>_>::pop_back
            ((deque<long,_std::allocator<long>_> *)&local_3f0);
  uVar13 = local_500 + 1;
  goto LAB_001913a1;
}

Assistant:

bool CrateReader::BuildNodeHierarchy(
    std::vector<uint32_t> const &pathIndexes,
    std::vector<int32_t> const &elementTokenIndexes,
    std::vector<int32_t> const &jumps,
    std::vector<bool> &visit_table, /* inout */
    size_t _curIndex,
    int64_t _parentNodeIndex) {

  (void)elementTokenIndexes;

  std::stack<int64_t> parentNodeIndexStack;
  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;

  size_t nIter = 0;
  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  size_t startIndex = _curIndex;
  size_t endIndex = pathIndexes.size() - 1;
  int64_t parentNodeIndex = _parentNodeIndex;

  // NOTE: Need to indirectly lookup index through pathIndexes[] when accessing
  // `_nodes`
  while (nIter < maxIter) {

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      if (parentNodeIndex == -1) {
        // root node.
        // Assume single root node in the scene.
        //assert(thisIndex == 0);
        if (thisIndex != 0) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "TODO: Multiple root nodes.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }

        _nodes[pathIdx] = Node(parentNodeIndex, _paths[pathIdx]);
        visit_table[pathIdx] = true;

        parentNodeIndex = int64_t(thisIndex);

      } else {
        //if (parentNodeIndex >= int64_t(_nodes.size())) {
        //  PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        //}

        if (parentNodeIndex >= int64_t(pathIndexes.size())) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        DCOUT("Hierarchy. parent[" << pathIndexes[size_t(parentNodeIndex)]
                                   << "].add_child = " << pathIndexes[thisIndex]);

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }


        // Ensure parent is not set yet.
        if (_nodes[pathIdx].GetParent() != -2) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "???: Maybe corrupted path hierarchy?.");
        }

        Node node(parentNodeIndex, _paths[pathIdx]);
        _nodes[pathIdx] = node;

        visit_table[pathIdx] = true;

        if (pathIdx >= _elemPaths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        //std::string name = _paths[pathIndexes[thisIndex]].local_path_name();
        std::string name = _elemPaths[pathIdx].full_path_name();
        DCOUT("childName = " << name);

        size_t parentNodeIdx = size_t(parentNodeIndex);
        if (parentNodeIdx >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "ParentNodeIdx out-of-range.");
        }

        size_t parentPathIdx = pathIndexes[parentNodeIdx];
        if (parentPathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (!_nodes[parentPathIdx].AddChildren(
            name, pathIdx)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid path index.");
        }
      }

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Index is out-of-range");
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);

      if (hasChild) {
        if (hasSibling) {
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.
                parentNodeIndexStack.push(int64_t(thisIndex));
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);
            parentNodeIndexStack.push(parentNodeIndex);

            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }
        // Have a child (may have also had a sibling). Reset parent node index
        parentNodeIndex = int64_t(thisIndex);
        DCOUT("parentNodeIndex = " << parentNodeIndex);
      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentNodeIndex = parentNodeIndexStack.top();
    parentNodeIndexStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}